

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O1

void av1_tile_init(TileInfo *tile,AV1_COMMON *cm,int row,int col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  bVar1 = (byte)cm->seq_params->mib_size_log2;
  iVar2 = (cm->tiles).row_start_sb[row];
  iVar3 = (cm->tiles).row_start_sb[(long)row + 1] << (bVar1 & 0x1f);
  tile->tile_row = row;
  tile->mi_row_start = iVar2 << (bVar1 & 0x1f);
  iVar2 = (cm->mi_params).mi_rows;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  tile->mi_row_end = iVar3;
  iVar2 = (cm->tiles).col_start_sb[col];
  iVar3 = (cm->tiles).col_start_sb[(long)col + 1] << (bVar1 & 0x1f);
  tile->tile_col = col;
  tile->mi_col_start = iVar2 << (bVar1 & 0x1f);
  iVar2 = (cm->mi_params).mi_cols;
  if (iVar2 <= iVar3) {
    iVar3 = iVar2;
  }
  tile->mi_col_end = iVar3;
  return;
}

Assistant:

void av1_tile_init(TileInfo *tile, const AV1_COMMON *cm, int row, int col) {
  av1_tile_set_row(tile, cm, row);
  av1_tile_set_col(tile, cm, col);
}